

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O2

double HTS_white_noise(HTS_Vocoder *v)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  bool bVar4;
  double dVar5;
  
  if (v->gauss == '\0') {
    uVar1 = v->x;
    bVar4 = (uVar1 & 2) == 0;
    uVar2 = (uVar1 >> 1) + 0x80000000;
    if (bVar4 == ((uVar1 >> 0x1d & 1) == 0)) {
      uVar2 = uVar1 >> 1;
    }
    v->x = uVar2;
    dVar5 = (double)(int)(-(uint)bVar4 | 1);
  }
  else {
    if (v->sw == '\0') {
      v->sw = '\x01';
      pdVar3 = &v->r1;
      do {
        do {
          dVar5 = HTS_rnd(&v->next);
          v->r1 = dVar5 + dVar5 + -1.0;
          dVar5 = HTS_rnd(&v->next);
          dVar5 = dVar5 + dVar5 + -1.0;
          v->r2 = dVar5;
          dVar5 = v->r1 * v->r1 + dVar5 * dVar5;
          v->s = dVar5;
        } while (1.0 < dVar5);
      } while ((dVar5 == 0.0) && (!NAN(dVar5)));
      dVar5 = log(dVar5);
      dVar5 = (dVar5 * -2.0) / v->s;
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      v->s = dVar5;
    }
    else {
      v->sw = '\0';
      dVar5 = v->r2;
      pdVar3 = &v->s;
    }
    dVar5 = dVar5 * *pdVar3;
  }
  return dVar5;
}

Assistant:

static double HTS_white_noise(HTS_Vocoder * v)
{
   if (v->gauss)
      return (double) HTS_nrandom(v);
   else
      return (double) HTS_mseq(v);
}